

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

string * __thiscall Archive::Child::getName_abi_cxx11_(string *__return_storage_ptr__,Child *this)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  undefined1 local_1c8 [8];
  string addr;
  undefined1 local_40 [8];
  string name;
  
  getRawName_abi_cxx11_((string *)local_40,this);
  if (*(char *)local_40 == '/') {
    if (name._M_dataplus._M_p == (pointer)0x2) {
      if (*(char *)((long)local_40 + 1) != '/') goto LAB_00c8abcb;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_40 == (undefined1  [8])&name._M_string_length) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
        *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
             name.field_2._M_allocated_capacity;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
      }
      __return_storage_ptr__->_M_string_length = 2;
    }
    else {
      if (name._M_dataplus._M_p != (pointer)0x1) {
LAB_00c8abcb:
        std::__cxx11::string::substr((ulong)local_1c8,(ulong)local_40);
        uVar3 = std::__cxx11::stoi((string *)local_1c8,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)local_1c8);
        if ((int)uVar3 < 0) {
LAB_00c8acc5:
          ::wasm::Fatal::Fatal((Fatal *)local_1c8);
          ::wasm::Fatal::operator<<
                    ((Fatal *)local_1c8,(char (*) [40])"Malformed archive: name parsing failed\n");
          ::wasm::Fatal::~Fatal((Fatal *)local_1c8);
        }
        uVar1 = (this->parent->stringTable).len;
        if (uVar1 <= uVar3) goto LAB_00c8acc5;
        puVar2 = (this->parent->stringTable).data;
        local_1c8 = (undefined1  [8])&addr._M_string_length;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_1c8,puVar2 + uVar3,puVar2 + uVar1);
        std::__cxx11::string::find((char)local_1c8,10);
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_1c8);
        std::__cxx11::string::~string((string *)local_1c8);
        goto LAB_00c8acab;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_40 == (undefined1  [8])&name._M_string_length) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
        *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
             name.field_2._M_allocated_capacity;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
      }
      __return_storage_ptr__->_M_string_length = 1;
    }
  }
  else {
    if (((char *)((long)local_40 + -1))[(long)name._M_dataplus._M_p] == '/') {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_40);
      goto LAB_00c8acab;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == (undefined1  [8])&name._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
           name.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)name._M_dataplus._M_p;
  }
  local_40 = (undefined1  [8])&name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
LAB_00c8acab:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Archive::Child::getName() const {
  std::string name = getRawName();
  // Check if it's a special name.
  if (name[0] == '/') {
    if (name.size() == 1) { // Linker member.
      return name;
    }
    if (name.size() == 2 && name[1] == '/') { // String table.
      return name;
    }
    // It's a long name.
    // Get the offset.
    int offset = std::stoi(name.substr(1), nullptr, 10);

    // Verify it.
    if (offset < 0 || (unsigned)offset >= parent->stringTable.len) {
      wasm::Fatal() << "Malformed archive: name parsing failed\n";
    }

    std::string addr(parent->stringTable.data + offset,
                     parent->stringTable.data + parent->stringTable.len);

    // GNU long file names end with a "/\n".
    size_t end = addr.find('\n');
    return addr.substr(0, end - 1);
  }
  // It's a simple name.
  if (name[name.size() - 1] == '/') {
    return name.substr(0, name.size() - 1);
  }
  return name;
}